

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.cc
# Opt level: O2

Optional<webrtc::CartesianPoint<float>_>
webrtc::GetArrayNormalIfExists
          (vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
           *array_geometry)

{
  CartesianPoint<float> *pCVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  Optional<webrtc::CartesianPoint<float>_> OVar6;
  Optional<webrtc::CartesianPoint<float>_> local_48;
  Optional<webrtc::CartesianPoint<float>_> local_38;
  undefined1 local_28 [16];
  
  uVar3 = 0x100000000;
  OVar6 = GetDirectionIfLinear(array_geometry);
  local_38.value_.c._0_8_ = OVar6.value_.c._0_8_;
  local_38.value_.c[2] = OVar6.value_.c[2];
  local_38.has_value_ = OVar6.has_value_;
  if ((OVar6._8_8_ >> 0x20 & 1) == 0) {
    OVar6 = GetNormalIfPlanar(array_geometry);
    local_48.value_.c._0_8_ = OVar6.value_.c._0_8_;
    local_48.value_.c[2] = OVar6.value_.c[2];
    local_48.has_value_ = OVar6.has_value_;
    local_28._0_4_ = 0.0;
    fVar5 = 0.0;
    if (((undefined1  [16])OVar6 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
      uVar4 = 0;
      uVar2 = 0;
      uVar3 = 0;
    }
    else {
      pCVar1 = rtc::Optional<webrtc::CartesianPoint<float>_>::operator->(&local_48);
      if (1e-06 < pCVar1->c[2] || pCVar1->c[2] == 1e-06) {
        uVar4 = 0;
        uVar2 = 0;
        uVar3 = 0;
        local_28._0_4_ = 0.0;
        fVar5 = 0.0;
      }
      else {
        local_28._0_4_ = local_48.value_.c[0];
        fVar5 = local_48.value_.c[1];
        uVar3 = (ulong)(uint)local_48.value_.c[2];
        uVar4 = (ulong)(byte)local_48._15_1_ << 0x38 | (ulong)(ushort)local_48._13_2_ << 0x28;
        uVar2 = (ulong)local_48.has_value_ << 0x20;
      }
    }
    uVar3 = uVar4 | uVar2 | uVar3;
  }
  else {
    pCVar1 = rtc::Optional<webrtc::CartesianPoint<float>_>::operator->(&local_38);
    local_28 = ZEXT416((uint)pCVar1->c[1]);
    pCVar1 = rtc::Optional<webrtc::CartesianPoint<float>_>::operator->(&local_38);
    fVar5 = -pCVar1->c[0];
  }
  OVar6.value_.c[1] = fVar5;
  OVar6.value_.c[0] = (float)local_28._0_4_;
  OVar6.value_.c[2] = (float)(int)uVar3;
  OVar6.has_value_ = (bool)(char)(uVar3 >> 0x20);
  OVar6._13_3_ = (int3)(uVar3 >> 0x28);
  return OVar6;
}

Assistant:

rtc::Optional<Point> GetArrayNormalIfExists(
    const std::vector<Point>& array_geometry) {
  const rtc::Optional<Point> direction = GetDirectionIfLinear(array_geometry);
  if (direction) {
    return rtc::Optional<Point>(Point(direction->y(), -direction->x(), 0.f));
  }
  const rtc::Optional<Point> normal = GetNormalIfPlanar(array_geometry);
  if (normal && normal->z() < kMaxDotProduct) {
    return normal;
  }
  return rtc::Optional<Point>();
}